

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

QString * __thiscall QFont::toString(QString *__return_storage_ptr__,QFont *this)

{
  QFontPrivate *pQVar1;
  QString *pQVar2;
  longlong __old_val;
  QTypedArrayData<char16_t> *__old_val_3;
  longlong __old_val_5;
  qsizetype qVar3;
  char16_t *__old_val_7;
  longlong __old_val_8;
  QTypedArrayData<char16_t> *__old_val_9;
  QTypedArrayData<char16_t> *__old_val_1;
  Data *pDVar4;
  char16_t *__old_val_2;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QArrayData *local_20f8;
  char16_t *pcStack_20f0;
  qsizetype local_20e8;
  QString local_20e0;
  QArrayData *local_20c8;
  char16_t *pcStack_20c0;
  qsizetype local_20b8;
  QString local_20b0;
  QArrayData *local_2098;
  char16_t *pcStack_2090;
  qsizetype local_2088;
  QString local_2080;
  QArrayData *local_2068;
  char16_t *pcStack_2060;
  qsizetype local_2058;
  QString local_2050;
  QArrayData *local_2038;
  char16_t *pcStack_2030;
  qsizetype local_2028;
  QString local_2020;
  QArrayData *local_2008;
  char16_t *pcStack_2000;
  qsizetype local_1ff8;
  QString local_1fe8;
  QArrayData *local_1fd0;
  char16_t *local_1fc8;
  qsizetype local_1fc0;
  QArrayData *local_1fb8;
  char16_t *local_1fb0;
  qsizetype local_1fa8;
  QArrayData *local_1fa0;
  char16_t *pcStack_1f98;
  qsizetype local_1f90;
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> local_1f88;
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> local_1f50;
  Data *local_1f18;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1f10;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1eb8;
  Data *local_1e60;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1e58;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1de0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1d60;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1cc8;
  Data *local_1c30;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1c28;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1b70;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1ab0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_19d8;
  Data *local_1900;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_18f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1800;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1700;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_15e8;
  Data *local_14d0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_14c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1390;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1250;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_10f8;
  Data *local_fa0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_f98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_e20;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_ca0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_b08;
  Data *local_970;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_968;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_7b0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_5f0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_418;
  Data *local_240;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_238;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a = 0x2c;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1->request).families.d.size == 0) {
    pDVar4 = (Data *)0x0;
    pcVar5 = (char16_t *)0x0;
    qVar3 = 0;
  }
  else {
    pQVar2 = (pQVar1->request).families.d.ptr;
    pDVar4 = (pQVar2->d).d;
    pcVar5 = (pQVar2->d).ptr;
    qVar3 = (pQVar2->d).size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QString::number((((this->d).d.ptr)->request).pointSize,(char)&local_1fa0,0x67);
  local_1f50.b.d.size = local_1f90;
  local_1f50.b.d.ptr = pcStack_1f98;
  local_1f50.b.d.d = (Data *)local_1fa0;
  local_1fa0 = (QArrayData *)0x0;
  pcStack_1f98 = (char16_t *)0x0;
  local_1f90 = 0;
  local_1f88.a.a.d.d = (Data *)0x0;
  local_1f88.a.a.d.ptr = (char16_t *)0x0;
  local_1f88.a.a.d.size = 0;
  local_1f88.b.d.d = (Data *)0x0;
  local_1f88.b.d.ptr = (char16_t *)0x0;
  local_1f88.b.d.size = 0;
  local_1f88.a.b = (QChar *)&local_3a;
  local_1f50.a.a.d.d = pDVar4;
  local_1f50.a.a.d.ptr = pcVar5;
  local_1f50.a.a.d.size = qVar3;
  local_1f50.a.b = (QChar *)&local_3a;
  local_1f18 = (Data *)&local_3a;
  QString::number((int)&local_1fb8,(int)(((this->d).d.ptr)->request).pixelSize);
  local_1eb8.a.a.b.d.size = local_1f50.b.d.size;
  local_1eb8.a.a.b.d.ptr = local_1f50.b.d.ptr;
  local_1eb8.a.a.b.d.d = local_1f50.b.d.d;
  local_1eb8.a.a.a.a.d.size = local_1f50.a.a.d.size;
  local_1eb8.a.a.a.a.d.ptr = local_1f50.a.a.d.ptr;
  local_1eb8.a.a.a.a.d.d = local_1f50.a.a.d.d;
  local_1eb8.b.d.size = local_1fa8;
  local_1eb8.b.d.ptr = local_1fb0;
  local_1eb8.b.d.d = (Data *)local_1fb8;
  local_1f50.a.a.d.d = (Data *)0x0;
  local_1f50.a.a.d.ptr = (char16_t *)0x0;
  local_1f50.a.a.d.size = 0;
  local_1f10.a.a.a.b = local_1f50.a.b;
  local_1f50.b.d.d = (Data *)0x0;
  local_1f50.b.d.ptr = (char16_t *)0x0;
  local_1f50.b.d.size = 0;
  local_1f10.a.b = (QChar *)local_1f18;
  local_1fb8 = (QArrayData *)0x0;
  local_1fb0 = (char16_t *)0x0;
  local_1fa8 = 0;
  local_1f10.a.a.a.a.d.d = (Data *)0x0;
  local_1f10.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1f10.a.a.a.a.d.size = 0;
  local_1eb8.a.a.a.b = local_1f50.a.b;
  local_1f10.a.a.b.d.d = (Data *)0x0;
  local_1f10.a.a.b.d.ptr = (char16_t *)0x0;
  local_1f10.a.a.b.d.size = 0;
  local_1eb8.a.b = (QChar *)local_1f18;
  local_1f10.b.d.d = (Data *)0x0;
  local_1f10.b.d.ptr = (char16_t *)0x0;
  local_1f10.b.d.size = 0;
  local_1e60 = (Data *)&local_3a;
  QString::number((int)&local_1fd0,(uint)(byte)(((this->d).d.ptr)->request).field_0x64);
  local_1de0.a.a.a.b.d.size = local_1eb8.b.d.size;
  local_1de0.a.a.a.b.d.ptr = local_1eb8.b.d.ptr;
  local_1de0.a.a.a.b.d.d = local_1eb8.b.d.d;
  local_1de0.a.a.a.a.a.b.d.size = local_1eb8.a.a.b.d.size;
  local_1de0.a.a.a.a.a.b.d.d = local_1eb8.a.a.b.d.d;
  local_1de0.a.a.a.a.a.a.a.d.size = local_1eb8.a.a.a.a.d.size;
  local_1de0.a.a.a.a.a.a.a.d.ptr = local_1eb8.a.a.a.a.d.ptr;
  local_1de0.a.b.d.size = local_1fc0;
  local_1de0.a.b.d.ptr = local_1fc8;
  local_1de0.a.b.d.d = (Data *)local_1fd0;
  local_1fd0 = (QArrayData *)0x0;
  local_1fc8 = (char16_t *)0x0;
  local_1fc0 = 0;
  local_1de0.a.a.a.a.a.a.a.d.d = local_1eb8.a.a.a.a.d.d;
  local_1eb8.a.a.a.a.d.d = (Data *)0x0;
  local_1eb8.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1eb8.a.a.a.a.d.size = 0;
  local_1e58.a.a.a.a.a.b = local_1eb8.a.a.a.b;
  local_1de0.a.a.a.a.a.a.b = local_1eb8.a.a.a.b;
  local_1eb8.a.a.b.d.d = (Data *)0x0;
  local_1de0.a.a.a.a.a.b.d.ptr = local_1eb8.a.a.b.d.ptr;
  local_1eb8.a.a.b.d.ptr = (char16_t *)0x0;
  local_1eb8.a.a.b.d.size = 0;
  local_1e58.a.a.a.b = local_1eb8.a.b;
  local_1de0.a.a.a.a.b = local_1eb8.a.b;
  local_1eb8.b.d.d = (Data *)0x0;
  local_1eb8.b.d.ptr = (char16_t *)0x0;
  local_1eb8.b.d.size = 0;
  local_1e58.a.b = (QChar *)local_1e60;
  local_1de0.a.a.b = (QChar *)local_1e60;
  local_1e58.a.a.a.a.a.a.d.d = (Data *)0x0;
  local_1e58.a.a.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1e58.a.a.a.a.a.a.d.size = 0;
  local_1e58.a.a.a.a.b.d.d = (Data *)0x0;
  local_1e58.a.a.a.a.b.d.ptr = (char16_t *)0x0;
  local_1e58.a.a.a.a.b.d.size = 0;
  local_1e58.a.a.b.d.d = (Data *)0x0;
  local_1e58.a.a.b.d.ptr = (char16_t *)0x0;
  local_1e58.a.a.b.d.size = 0;
  local_1e58.b.d.d = (Data *)0x0;
  local_1e58.b.d.ptr = (char16_t *)0x0;
  local_1e58.b.d.size = 0;
  local_1de0.b = (QChar *)&local_3a;
  QString::number((int)&local_1fe8,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x28) &
                  0x3ff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1d60,&local_1de0,&local_1fe8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1cc8,&local_1d60);
  local_1c30 = (Data *)&local_3a;
  QString::number((int)&local_2008,*(uint *)&(((this->d).d.ptr)->request).field_0x60 >> 0x1c & 3);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1c28,&local_1cc8);
  local_1c28.b.d.size = local_1ff8;
  local_1c28.b.d.ptr = pcStack_2000;
  local_1c28.b.d.d = (Data *)local_2008;
  local_1c28.a.b = (QChar *)local_1c30;
  local_2008 = (QArrayData *)0x0;
  pcStack_2000 = (char16_t *)0x0;
  local_1ff8 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1b70,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1c28);
  local_1b70.a.b.d.ptr = local_1c28.b.d.ptr;
  local_1b70.a.b.d.d = local_1c28.b.d.d;
  local_1c28.b.d.d = (Data *)0x0;
  local_1c28.b.d.ptr = (char16_t *)0x0;
  local_1b70.a.a.b = local_1c28.a.b;
  local_1b70.a.b.d.size = local_1c28.b.d.size;
  local_1c28.b.d.size = 0;
  local_1b70.b = (QChar *)&local_3a;
  QString::number((int)&local_2020,(byte)((this->d).d.ptr)->field_0x7c & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1ab0,&local_1b70,&local_2020);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_19d8,&local_1ab0);
  local_1900 = (Data *)&local_3a;
  QString::number((int)&local_2038,*(uint *)&((this->d).d.ptr)->field_0x7c >> 2 & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_18f8,&local_19d8);
  local_18f8.b.d.size = local_2028;
  local_18f8.b.d.ptr = pcStack_2030;
  local_18f8.b.d.d = (Data *)local_2038;
  local_18f8.a.b = (QChar *)local_1900;
  local_2038 = (QArrayData *)0x0;
  pcStack_2030 = (char16_t *)0x0;
  local_2028 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1800,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_18f8);
  local_1800.a.b.d.ptr = local_18f8.b.d.ptr;
  local_1800.a.b.d.d = local_18f8.b.d.d;
  local_18f8.b.d.d = (Data *)0x0;
  local_18f8.b.d.ptr = (char16_t *)0x0;
  local_1800.a.a.b = local_18f8.a.b;
  local_1800.a.b.d.size = local_18f8.b.d.size;
  local_18f8.b.d.size = 0;
  local_1800.b = (QChar *)&local_3a;
  QString::number((int)&local_2050,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x32) & 1
                 );
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1700,&local_1800,&local_2050);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_15e8,&local_1700);
  local_14d0 = (Data *)&local_3a;
  QString::number((int)&local_2068,0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_14c8,&local_15e8);
  local_14c8.b.d.size = local_2058;
  local_14c8.b.d.ptr = pcStack_2060;
  local_14c8.b.d.d = (Data *)local_2068;
  local_14c8.a.b = (QChar *)local_14d0;
  local_2068 = (QArrayData *)0x0;
  pcStack_2060 = (char16_t *)0x0;
  local_2058 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1390,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_14c8);
  local_1390.a.b.d.ptr = local_14c8.b.d.ptr;
  local_1390.a.b.d.d = local_14c8.b.d.d;
  local_14c8.b.d.d = (Data *)0x0;
  local_14c8.b.d.ptr = (char16_t *)0x0;
  local_1390.a.a.b = local_14c8.a.b;
  local_1390.a.b.d.size = local_14c8.b.d.size;
  local_14c8.b.d.size = 0;
  local_1390.b = (QChar *)&local_3a;
  QString::number((int)&local_2080,*(uint *)&((this->d).d.ptr)->field_0x7c >> 4 & 7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1250,&local_1390,&local_2080);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_10f8,&local_1250);
  local_fa0 = (Data *)&local_3a;
  QString::number((int)&local_2098,(uint)((byte)((this->d).d.ptr)->field_0x7c >> 7));
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_f98,&local_10f8);
  local_f98.b.d.size = local_2088;
  local_f98.b.d.ptr = pcStack_2090;
  local_f98.b.d.d = (Data *)local_2098;
  local_f98.a.b = (QChar *)local_fa0;
  local_2098 = (QArrayData *)0x0;
  pcStack_2090 = (char16_t *)0x0;
  local_2088 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_e20,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_f98);
  local_e20.a.b.d.ptr = local_f98.b.d.ptr;
  local_e20.a.b.d.d = local_f98.b.d.d;
  local_f98.b.d.d = (Data *)0x0;
  local_f98.b.d.ptr = (char16_t *)0x0;
  local_e20.a.a.b = local_f98.a.b;
  local_e20.a.b.d.size = local_f98.b.d.size;
  local_f98.b.d.size = 0;
  local_e20.b = (QChar *)&local_3a;
  QString::number((double)(((this->d).d.ptr)->letterSpacing).val * 0.015625,(char)&local_20b0,0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_ca0,&local_e20,&local_20b0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_b08,&local_ca0);
  local_970 = (Data *)&local_3a;
  QString::number((double)(((this->d).d.ptr)->wordSpacing).val * 0.015625,(char)&local_20c8,0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_968,&local_b08);
  local_968.b.d.size = local_20b8;
  local_968.b.d.ptr = pcStack_20c0;
  local_968.b.d.d = (Data *)local_20c8;
  local_968.a.b = (QChar *)local_970;
  local_20c8 = (QArrayData *)0x0;
  pcStack_20c0 = (char16_t *)0x0;
  local_20b8 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_7b0,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_968);
  local_7b0.a.b.d.ptr = local_968.b.d.ptr;
  local_7b0.a.b.d.d = local_968.b.d.d;
  local_968.b.d.d = (Data *)0x0;
  local_968.b.d.ptr = (char16_t *)0x0;
  local_7b0.a.a.b = local_968.a.b;
  local_7b0.a.b.d.size = local_968.b.d.size;
  local_968.b.d.size = 0;
  local_7b0.b = (QChar *)&local_3a;
  QString::number((int)&local_20e0,*(ushort *)&(((this->d).d.ptr)->request).field_0x62 & 0xfff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_5f0,&local_7b0,&local_20e0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_418,&local_5f0);
  local_240 = (Data *)&local_3a;
  QString::number((int)&local_20f8,(uint)*(ushort *)&(((this->d).d.ptr)->request).field_0x60);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_238,&local_418);
  local_238.b.d.size = local_20e8;
  local_238.b.d.ptr = pcStack_20f0;
  local_238.b.d.d = (Data *)local_20f8;
  local_238.a.b = (QChar *)local_240;
  local_20f8 = (QArrayData *)0x0;
  pcStack_20f0 = (char16_t *)0x0;
  local_20e8 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::convertTo<QString>(__return_storage_ptr__,&local_238);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_238);
  if (local_20f8 != (QArrayData *)0x0) {
    LOCK();
    (local_20f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_20f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_20f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_20f8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_418);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_5f0);
  if (&(local_20e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20e0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_7b0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_968);
  if (local_20c8 != (QArrayData *)0x0) {
    LOCK();
    (local_20c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_20c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_20c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_20c8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_b08);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_ca0);
  if (&(local_20b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20b0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_e20.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_f98);
  if (local_2098 != (QArrayData *)0x0) {
    LOCK();
    (local_2098->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2098->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2098->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2098,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_10f8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1250);
  if (&(local_2080.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2080.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1390.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_14c8);
  if (local_2068 != (QArrayData *)0x0) {
    LOCK();
    (local_2068->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2068->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2068->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2068,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_15e8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1700);
  if (&(local_2050.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2050.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2050.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1800.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_18f8);
  if (local_2038 != (QArrayData *)0x0) {
    LOCK();
    (local_2038->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2038->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2038->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2038,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_19d8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1ab0);
  if (&(local_2020.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2020.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2020.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2020.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2020.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1b70.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1c28);
  if (local_2008 != (QArrayData *)0x0) {
    LOCK();
    (local_2008->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2008->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2008->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2008,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1cc8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1d60);
  if (&(local_1fe8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1fe8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1fe8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1fe8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1fe8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1de0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1e58);
  if (local_1fd0 != (QArrayData *)0x0) {
    LOCK();
    (local_1fd0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fd0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fd0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fd0,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1eb8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1f10);
  if (local_1fb8 != (QArrayData *)0x0) {
    LOCK();
    (local_1fb8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fb8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fb8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fb8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f50);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f88);
  if (local_1fa0 != (QArrayData *)0x0) {
    LOCK();
    (local_1fa0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fa0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fa0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fa0,2,0x10);
    }
  }
  pQVar1 = (this->d).d.ptr;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d =
       (pQVar1->request).styleName.d.d;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr =
       (pQVar1->request).styleName.d.ptr;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size =
       (pQVar1->request).styleName.d.size;
  if (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)
     &((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      ).ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)
          &((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
           super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size != 0) {
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d = (Data *)&local_3a;
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr = (char16_t *)&local_238
    ;
    ::operator+=(__return_storage_ptr__,(QStringBuilder<const_QChar_&,_QString_&> *)&local_418);
  }
  if (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      != (QArrayData *)0x0) {
    LOCK();
    ((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData).
    ref_._q_value.super___atomic_base<int>._M_i =
         ((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
         super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
        super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::toString() const
{
    const QChar comma(u',');
    QString fontDescription = family() + comma +
        QString::number(     pointSizeF()) + comma +
        QString::number(      pixelSize()) + comma +
        QString::number((int) styleHint()) + comma +
        QString::number(         weight()) + comma +
        QString::number((int)     style()) + comma +
        QString::number((int) underline()) + comma +
        QString::number((int) strikeOut()) + comma +
        QString::number((int)fixedPitch()) + comma +
        QString::number((int)   false) + comma +
        QString::number((int)capitalization()) + comma +
        QString::number((int)letterSpacingType()) + comma +
        QString::number(letterSpacing()) + comma +
        QString::number(wordSpacing()) + comma +
        QString::number(stretch()) + comma +
        QString::number((int)styleStrategy());

    QString fontStyle = styleName();
    if (!fontStyle.isEmpty())
        fontDescription += comma + fontStyle;

    return fontDescription;
}